

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O3

void do_sitetrack(CHAR_DATA *ch,char *argument)

{
  undefined8 uVar1;
  undefined8 uVar2;
  PC_DATA *pPVar3;
  bool bVar4;
  int iVar5;
  MYSQL *pMVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  undefined8 *puVar12;
  MYSQL *pMVar13;
  undefined8 uVar14;
  size_t sVar15;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  aVar16;
  uint uVar17;
  uint uVar18;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  basic_string_view<char> fmt_02;
  basic_string_view<char> fmt_03;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string listing;
  string query_buffer;
  char buf [4608];
  char query [4608];
  char arg2 [4608];
  char arg1 [4608];
  BUFFER *local_4ad8;
  long *local_4ab8 [2];
  long local_4aa8 [2];
  char *local_4a98;
  undefined8 local_4a90;
  char local_4a88;
  undefined7 uStack_4a87;
  MYSQL *local_4a78;
  long local_4a70;
  long *local_4a68 [3];
  undefined1 local_4a50 [32];
  char local_4a30 [504];
  char local_4838 [4608];
  char local_3638 [4608];
  long local_2438 [576];
  long local_1238 [577];
  
  local_4a98 = &local_4a88;
  local_4a90 = 0;
  local_4a88 = '\0';
  bVar4 = is_npc(ch);
  if (bVar4) goto LAB_002d1491;
  pMVar6 = open_conn();
  if (*argument == '\0') {
    local_4ad8 = new_buf();
    pMVar13 = open_conn();
    builtin_strncpy(local_3638,"SELECT site_id, denials, site_name from sitetracker",0x34);
    mysql_query(pMVar6);
    uVar14 = mysql_store_result(pMVar6);
    add_buf(local_4ad8,"ID #     Site                       Denials    Comments\n\r");
    while( true ) {
      puVar12 = (undefined8 *)mysql_fetch_row(uVar14);
      if (puVar12 == (undefined8 *)0x0) break;
      uVar17 = atoi((char *)*puVar12);
      sprintf(local_3638,"SELECT site_id FROM sitecomments WHERE site_id = %d",(ulong)uVar17);
      mysql_query(pMVar13,local_3638);
      uVar8 = mysql_store_result(pMVar13);
      uVar1 = puVar12[1];
      uVar2 = puVar12[2];
      uVar9 = mysql_affected_rows(pMVar13);
      sprintf(local_4838,"%4d     %-26s %-10s %ld\n\r",(ulong)uVar17,uVar2,uVar1,uVar9);
      mysql_free_result(uVar8);
      add_buf(local_4ad8,local_4838);
    }
    add_buf(local_4ad8,"Use sitetrack <id> to view more details.\n\r");
    add_buf(local_4ad8,"Use sitetrack comment <id> to enter a comment on the given site.\n\r");
    add_buf(local_4ad8,
            "Use sitetrack add <site IP, i.e. aol.com>.  Use numeric IP ONLY if it\'s unresolvable.\n\r"
           );
    iVar5 = get_trust(ch);
    if (0x39 < iVar5) {
      add_buf(local_4ad8,
              "Use sitetrack delcomment <comment id> to delete a comment, and sitetrack delsite <site id> to delete a site.\n\r"
             );
    }
    pcVar7 = buf_string(local_4ad8);
    page_to_char(pcVar7,ch);
    mysql_free_result(uVar14);
    mysql_close(pMVar6);
    mysql_close(pMVar13);
LAB_002d0fde:
    free_buf(local_4ad8);
    goto LAB_002d1491;
  }
  pcVar7 = one_argument(argument,(char *)local_1238);
  one_argument(pcVar7,(char *)local_2438);
  bVar4 = str_cmp((char *)local_1238,"add");
  if (bVar4) {
    bVar4 = str_cmp((char *)local_1238,"comment");
    if (bVar4) {
      bVar4 = str_cmp((char *)local_1238,"delcomment");
      if (!bVar4) {
        iVar5 = get_trust(ch);
        if (iVar5 < 0x3a) goto LAB_002d1186;
        fmt.size_ = 0xc;
        fmt.data_ = (char *)0x2c;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_4ab8;
        local_4ab8[0] = local_2438;
        ::fmt::v9::vformat_abi_cxx11_
                  ((string *)local_4a50,(v9 *)"DELETE FROM sitecomments WHERE comment_id={}",fmt,
                   args_01);
LAB_002d11db:
        std::__cxx11::string::operator=((string *)&local_4a98,(string *)local_4a50);
        if ((undefined1 *)local_4a50._0_8_ != local_4a50 + 0x10) {
          operator_delete((void *)local_4a50._0_8_,local_4a50._16_8_ + 1);
        }
        one_query(local_4a98);
        mysql_close(pMVar6);
        pcVar7 = "Ok.\n\r";
        goto LAB_002d122b;
      }
LAB_002d1186:
      bVar4 = str_cmp((char *)local_1238,"delsite");
      if (!bVar4) {
        iVar5 = get_trust(ch);
        if (0x39 < iVar5) {
          fmt_00.size_ = 0xc;
          fmt_00.data_ = (char *)0x28;
          args_02.field_1.args_ = in_R9.args_;
          args_02.desc_ = (unsigned_long_long)local_4ab8;
          local_4ab8[0] = local_2438;
          ::fmt::v9::vformat_abi_cxx11_
                    ((string *)local_4a50,(v9 *)"DELETE FROM sitetracker WHERE site_id={}",fmt_00,
                     args_02);
          goto LAB_002d11db;
        }
      }
      bVar4 = is_number((char *)local_1238);
      if (!bVar4) goto LAB_002d1491;
      local_4ad8 = new_buf();
      local_4a50._16_8_ = 0;
      local_4a50._0_8_ = &PTR_grow_0044b3a0;
      local_4a50._24_8_ = 500;
      aVar16.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)0x0;
      fmt_03.size_ = 0x2a;
      fmt_03.data_ = "SELECT * from sitetracker where site_id={}";
      args_00.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_4a68;
      args_00.desc_ = 0xc;
      local_4a68[0] = local_1238;
      local_4a50._8_8_ = local_4a30;
      ::fmt::v9::detail::vformat_to<char>((buffer<char> *)local_4a50,fmt_03,args_00,(locale_ref)0x0)
      ;
      local_4ab8[0] = local_4aa8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4ab8,local_4a50._8_8_,
                 (char *)(local_4a50._8_8_ + local_4a50._16_8_));
      if ((char *)local_4a50._8_8_ != local_4a30) {
        operator_delete((void *)local_4a50._8_8_,local_4a50._24_8_);
      }
      std::__cxx11::string::operator=((string *)&local_4a98,(string *)local_4ab8);
      if (local_4ab8[0] != local_4aa8) {
        operator_delete(local_4ab8[0],local_4aa8[0] + 1);
      }
      mysql_query(pMVar6,local_4a98);
      lVar10 = mysql_store_result(pMVar6);
      if (lVar10 != 0) {
        lVar11 = mysql_affected_rows(pMVar6);
        if (lVar11 != 0) {
          puVar12 = (undefined8 *)mysql_fetch_row(lVar10);
          sprintf(local_4838,"Viewing %s (id %s).\n\r",puVar12[1],*puVar12);
          send_to_char(local_4838,ch);
          sprintf(local_4838,"%s players from this site have been denied.",puVar12[2]);
          send_to_char("Comments:\n\r",ch);
          pMVar13 = open_conn();
          fmt_01.size_ = 0xc;
          fmt_01.data_ = (char *)0x2b;
          args_03.field_1.args_ = aVar16.args_;
          args_03.desc_ = (unsigned_long_long)local_4ab8;
          local_4ab8[0] = local_1238;
          ::fmt::v9::vformat_abi_cxx11_
                    ((string *)local_4a50,(v9 *)"SELECT * from sitecomments where site_id={}",fmt_01
                     ,args_03);
          std::__cxx11::string::operator=((string *)&local_4a98,(string *)local_4a50);
          if ((undefined1 *)local_4a50._0_8_ != local_4a50 + 0x10) {
            operator_delete((void *)local_4a50._0_8_,local_4a50._16_8_ + 1);
          }
          mysql_query(pMVar13,local_4a98);
          uVar14 = mysql_store_result(pMVar13);
          local_4838[0] = '\r';
          while( true ) {
            lVar11 = mysql_fetch_row(uVar14);
            if (lVar11 == 0) break;
            sprintf(local_4838,"Added by %s on %s (CID #%s):\n\r%s",*(undefined8 *)(lVar11 + 0x10),
                    *(undefined8 *)(lVar11 + 0x18),*(undefined8 *)(lVar11 + 8),
                    *(undefined8 *)(lVar11 + 0x20));
            add_buf(local_4ad8,local_4838);
          }
          if (local_4838[0] == '\r') {
            add_buf(local_4ad8,"(No comments)\n\r");
          }
          iVar5 = get_trust(ch);
          if (0x37 < iVar5) {
            add_buf(local_4ad8,"Players from site:\n\r");
            mysql_free_result(uVar14);
            sprintf(local_3638,"SELECT DISTINCT name FROM logins WHERE site RLIKE \'%s\'",puVar12[1]
                   );
            mysql_query(pMVar13,local_3638);
            uVar14 = mysql_store_result(pMVar13);
            local_4838[0] = '\0';
            uVar18 = 1;
            iVar5 = 0;
            uVar17 = 0;
            local_4a78 = pMVar13;
            local_4a70 = lVar10;
            while( true ) {
              puVar12 = (undefined8 *)mysql_fetch_row(uVar14);
              if (puVar12 == (undefined8 *)0x0) break;
              sprintf(local_3638,"%-12s",*puVar12);
              strcat(local_4838,local_3638);
              sVar15 = strlen(local_4838);
              pcVar7 = local_4838 + sVar15;
              if ((uVar18 / 5) * -5 + 1 == iVar5) {
                local_4838[sVar15 + 2] = '\0';
                pcVar7[0] = '\n';
                pcVar7[1] = '\r';
              }
              else {
                pcVar7[0] = ' ';
                pcVar7[1] = '\0';
              }
              iVar5 = iVar5 + -1;
              uVar18 = uVar18 + 1;
              uVar17 = uVar17 + 1;
            }
            if ((uVar17 / 5) * 5 + iVar5 == 0) {
              if (iVar5 == 0) {
                builtin_strncpy(local_4838,"(No players)\n\r",0xf);
              }
            }
            else {
              sVar15 = strlen(local_4838);
              (local_4838 + sVar15)[0] = '\n';
              (local_4838 + sVar15)[1] = '\r';
              local_4838[sVar15 + 2] = '\0';
            }
            lVar10 = local_4a70;
            pMVar13 = local_4a78;
            add_buf(local_4ad8,local_4838);
          }
          pcVar7 = buf_string(local_4ad8);
          page_to_char(pcVar7,ch);
          mysql_free_result(lVar10);
          mysql_free_result(uVar14);
          mysql_close(pMVar6);
          mysql_close(pMVar13);
          goto LAB_002d0fde;
        }
      }
      send_to_char("Invalid ID number.\n\r",ch);
    }
    else {
      if ((char)local_2438[0] == '\0') goto LAB_002d1491;
      bVar4 = is_number((char *)local_2438);
      if (!bVar4) goto LAB_002d1491;
      pcVar7 = palloc_string("");
      pPVar3 = ch->pcdata;
      pPVar3->entered_text = pcVar7;
      iVar5 = atoi((char *)local_2438);
      pPVar3->helpid = (short)iVar5;
      enter_text(ch,comment_end_fun);
    }
    mysql_close(pMVar6);
  }
  else {
    if ((char)local_2438[0] != '\0') {
      pcVar7 = escape_string((char *)local_2438);
      sprintf(local_3638,"INSERT INTO sitetracker VALUES(nullptr, \'%s\',0)",pcVar7);
      pMVar13 = open_conn();
      mysql_query(pMVar13,local_3638);
      mysql_close(pMVar13);
      local_4a50._16_8_ = 0;
      local_4a50._0_8_ = &PTR_grow_0044b3a0;
      local_4a50._24_8_ = 500;
      fmt_02.size_ = 0x6a;
      fmt_02.data_ = 
      "A new site ({}) was added to the IP listings.  You should add a comment now explaining why it was added.\n\r"
      ;
      args.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_4a68;
      args.desc_ = 0xc;
      local_4a68[0] = local_2438;
      local_4a50._8_8_ = local_4a30;
      ::fmt::v9::detail::vformat_to<char>((buffer<char> *)local_4a50,fmt_02,args,(locale_ref)0x0);
      local_4ab8[0] = local_4aa8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4ab8,local_4a50._8_8_,
                 (char *)(local_4a50._8_8_ + local_4a50._16_8_));
      if ((char *)local_4a50._8_8_ != local_4a30) {
        operator_delete((void *)local_4a50._8_8_,local_4a50._24_8_);
      }
      mysql_close(pMVar6);
      send_to_char((char *)local_4ab8[0],ch);
      if (local_4ab8[0] != local_4aa8) {
        operator_delete(local_4ab8[0],local_4aa8[0] + 1);
      }
      goto LAB_002d1491;
    }
    pcVar7 = "You must specify the site you wish to add.\n\r";
LAB_002d122b:
    send_to_char(pcVar7,ch);
  }
LAB_002d1491:
  if (local_4a98 != &local_4a88) {
    operator_delete(local_4a98,CONCAT71(uStack_4a87,local_4a88) + 1);
  }
  return;
}

Assistant:

void do_sitetrack(CHAR_DATA *ch, char *argument)
{
	MYSQL *conn, *conn2;
	MYSQL_RES *res_set, *res2;
	MYSQL_ROW row, row2;
	BUFFER *buffer;
	std::string query_buffer;
	char buf[MSL], arg1[MSL], arg2[MSL], query[MSL];
	char *escape;
	int id, results = 0;

	if (is_npc(ch))
		return;

	conn = open_conn();

	if (!strcmp(argument, ""))
	{
		buffer = new_buf();
		conn2 = open_conn();

		sprintf(query, "SELECT site_id, denials, site_name from sitetracker");
		mysql_query(conn, query);

		res_set = mysql_store_result(conn);

		add_buf(buffer, "ID #     Site                       Denials    Comments\n\r");

		while ((row = mysql_fetch_row(res_set)) != nullptr)
		{
			id = atoi(row[0]);

			sprintf(query, "SELECT site_id FROM sitecomments WHERE site_id = %d", id);
			mysql_query(conn2, query);

			res2 = mysql_store_result(conn2);
			sprintf(buf, "%4d     %-26s %-10s %ld\n\r", id, row[2], row[1], (long)mysql_affected_rows(conn2));
			mysql_free_result(res2);
			add_buf(buffer, buf);
		}

		add_buf(buffer, "Use sitetrack <id> to view more details.\n\r");
		add_buf(buffer, "Use sitetrack comment <id> to enter a comment on the given site.\n\r");
		add_buf(buffer, "Use sitetrack add <site IP, i.e. aol.com>.  Use numeric IP ONLY if it's unresolvable.\n\r");

		if (get_trust(ch) >= 58)
			add_buf(buffer, "Use sitetrack delcomment <comment id> to delete a comment, and sitetrack delsite <site id> to delete a site.\n\r");

		page_to_char(buf_string(buffer), ch);
		mysql_free_result(res_set);

		mysql_close(conn);
		mysql_close(conn2);
		free_buf(buffer);
		return;
	}

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (!str_cmp(arg1, "add"))
	{
		if (!strcmp(arg2, ""))
		{
			send_to_char("You must specify the site you wish to add.\n\r", ch);
			return;
		}

		escape = escape_string(arg2);
		sprintf(query, "INSERT INTO sitetracker VALUES(nullptr, '%s',0)", escape);
		one_query(query);

		auto listing = fmt::format("A new site ({}) was added to the IP listings.  You should add a comment now explaining why it was added.\n\r", arg2);

		mysql_close(conn);
		send_to_char(listing.c_str(), ch);
		return;
	}

	if (!str_cmp(arg1, "comment"))
	{
		if (!strcmp(arg2, "") || !is_number(arg2))
			return;

		ch->pcdata->entered_text = palloc_string("");
		ch->pcdata->helpid = atoi(arg2);
		enter_text(ch, comment_end_fun);

		mysql_close(conn);
		return;
	}

	if (!str_cmp(arg1, "delcomment") && get_trust(ch) >= 58)
	{
		query_buffer = fmt::format("DELETE FROM sitecomments WHERE comment_id={}", arg2);
		one_query(query_buffer.data());

		mysql_close(conn);
		send_to_char("Ok.\n\r", ch);
		return;
	}

	if (!str_cmp(arg1, "delsite") && get_trust(ch) >= 58)
	{
		query_buffer = fmt::format("DELETE FROM sitetracker WHERE site_id={}", arg2);
		one_query(query_buffer.data());

		mysql_close(conn);
		send_to_char("Ok.\n\r", ch);
		return;
	}

	if (is_number(arg1))
	{
		buffer = new_buf();
		query_buffer = fmt::format("SELECT * from sitetracker where site_id={}", arg1);
		mysql_query(conn, query_buffer.c_str());

		res_set = mysql_store_result(conn);

		if (!res_set || mysql_affected_rows(conn) < 1)
		{
			send_to_char("Invalid ID number.\n\r", ch);
			mysql_close(conn);
			return;
		}

		row = mysql_fetch_row(res_set);
		sprintf(buf, "Viewing %s (id %s).\n\r", row[1], row[0]);
		send_to_char(buf, ch);

		sprintf(buf, "%s players from this site have been denied.", row[2]);
		send_to_char("Comments:\n\r", ch);

		conn2 = open_conn();
		query_buffer = fmt::format("SELECT * from sitecomments where site_id={}", arg1);
		mysql_query(conn2, query_buffer.c_str());

		res2 = mysql_store_result(conn2);
		buf[0] = '\r';

		while ((row2 = mysql_fetch_row(res2)))
		{
			sprintf(buf, "Added by %s on %s (CID #%s):\n\r%s", row2[2], row2[3], row2[1], row2[4]);
			add_buf(buffer, buf);
		}

		if (buf[0] == '\r')
			add_buf(buffer, "(No comments)\n\r");

		if (get_trust(ch) >= 56)
		{
			add_buf(buffer, "Players from site:\n\r");

			mysql_free_result(res2);

			sprintf(query, "SELECT DISTINCT name FROM logins WHERE site RLIKE '%s'", row[1]);
			mysql_query(conn2, query);

			res2 = mysql_store_result(conn2);
			buf[0] = '\0';

			while ((row2 = mysql_fetch_row(res2)))
			{
				sprintf(query, "%-12s", row2[0]);
				strcat(buf, query);

				if (++results % 5 == 0)
					strcat(buf, "\n\r");
				else
					strcat(buf, " ");
			}

			if (results && results % 5)
				strcat(buf, "\n\r");
			if (!results)
				sprintf(buf, "(No players)\n\r");

			add_buf(buffer, buf);
		}

		page_to_char(buf_string(buffer), ch);
		mysql_free_result(res_set);
		mysql_free_result(res2);

		mysql_close(conn);
		mysql_close(conn2);
		free_buf(buffer);
	}
}